

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O1

void next_leaves(dna_bwt_t *bwt1,dna_bwt_t *bwt2,sa_leaf *L1,sa_leaf *L2,
                vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
                *TMP_LEAVES,int *t,int min_size)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  pointer ppVar4;
  ulong uVar5;
  __normal_iterator<std::pair<sa_leaf,_sa_leaf>_*,_std::vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>_>
  __i;
  pointer ppVar6;
  long lVar7;
  p_range ext_2;
  p_range ext_1;
  p_range local_b0;
  p_range local_70;
  
  uVar5 = (ulong)min_size;
  dna_bwt<dna_string>::LF(&local_70,bwt1,L1->rn);
  dna_bwt<dna_string>::LF(&local_b0,bwt2,L2->rn);
  *t = 0;
  if (uVar5 <= ((local_70.A.second - local_70.A.first) - local_b0.A.first) + local_b0.A.second) {
    uVar2 = L1->depth;
    uVar3 = L2->depth;
    *t = 1;
    ppVar4 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (ppVar4->first).rn.first = local_70.A.first;
    (ppVar4->first).rn.second = local_70.A.second;
    (ppVar4->first).depth = uVar2 + 1;
    (ppVar4->second).rn.first = local_b0.A.first;
    (ppVar4->second).rn.second = local_b0.A.second;
    (ppVar4->second).depth = uVar3 + 1;
  }
  if (uVar5 <= ((local_70.C.second - local_70.C.first) - local_b0.C.first) + local_b0.C.second) {
    uVar2 = L1->depth;
    uVar3 = L2->depth;
    iVar1 = *t;
    *t = iVar1 + 1;
    ppVar4 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar4[iVar1].first.rn.first = local_70.C.first;
    ppVar4[iVar1].first.rn.second = local_70.C.second;
    ppVar4[iVar1].first.depth = uVar2 + 1;
    ppVar4[iVar1].second.rn.first = local_b0.C.first;
    ppVar4[iVar1].second.rn.second = local_b0.C.second;
    ppVar4[iVar1].second.depth = uVar3 + 1;
  }
  if (uVar5 <= ((local_70.G.second - local_70.G.first) - local_b0.G.first) + local_b0.G.second) {
    uVar2 = L1->depth;
    uVar3 = L2->depth;
    iVar1 = *t;
    *t = iVar1 + 1;
    ppVar4 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar4[iVar1].first.rn.first = local_70.G.first;
    ppVar4[iVar1].first.rn.second = local_70.G.second;
    ppVar4[iVar1].first.depth = uVar2 + 1;
    ppVar4[iVar1].second.rn.first = local_b0.G.first;
    ppVar4[iVar1].second.rn.second = local_b0.G.second;
    ppVar4[iVar1].second.depth = uVar3 + 1;
  }
  if (uVar5 <= ((local_70.T.second - local_70.T.first) - local_b0.T.first) + local_b0.T.second) {
    uVar2 = L1->depth;
    uVar3 = L2->depth;
    iVar1 = *t;
    *t = iVar1 + 1;
    ppVar4 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar4[iVar1].first.rn.first = local_70.T.first;
    ppVar4[iVar1].first.rn.second = local_70.T.second;
    ppVar4[iVar1].first.depth = uVar2 + 1;
    ppVar4[iVar1].second.rn.first = local_b0.T.first;
    ppVar4[iVar1].second.rn.second = local_b0.T.second;
    ppVar4[iVar1].second.depth = uVar3 + 1;
  }
  iVar1 = *t;
  uVar5 = (ulong)iVar1;
  if (uVar5 != 0) {
    ppVar4 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
              (ppVar4,ppVar4 + uVar5,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if (iVar1 < 0x11) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
                (ppVar4,ppVar4 + uVar5);
    }
    else {
      ppVar6 = ppVar4 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
                (ppVar4,ppVar6);
      lVar7 = uVar5 * 0x30 + -0x300;
      do {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,__gnu_cxx::__ops::_Val_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
                  (ppVar6);
        ppVar6 = ppVar6 + 1;
        lVar7 = lVar7 + -0x30;
      } while (lVar7 != 0);
    }
  }
  return;
}

Assistant:

void next_leaves(dna_bwt_t * bwt1, dna_bwt_t * bwt2, sa_leaf & L1, sa_leaf & L2, vector<pair<sa_leaf, sa_leaf> > & TMP_LEAVES, int & t, int min_size){

	p_range ext_1 = bwt1->LF(L1.rn);
	p_range ext_2 = bwt2->LF(L2.rn);

	//push non-empty leaves on stack in decreasing size order

	t = 0;

	if(range_length(ext_1.A) + range_length(ext_2.A) >= min_size) TMP_LEAVES[t++] = {{ext_1.A, L1.depth+1},{ext_2.A, L2.depth+1}};
	if(range_length(ext_1.C) + range_length(ext_2.C) >= min_size) TMP_LEAVES[t++] = {{ext_1.C, L1.depth+1},{ext_2.C, L2.depth+1}};
	if(range_length(ext_1.G) + range_length(ext_2.G) >= min_size) TMP_LEAVES[t++] = {{ext_1.G, L1.depth+1},{ext_2.G, L2.depth+1}};
	if(range_length(ext_1.T) + range_length(ext_2.T) >= min_size) TMP_LEAVES[t++] = {{ext_1.T, L1.depth+1},{ext_2.T, L2.depth+1}};

	std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const pair<sa_leaf, sa_leaf>& lhs, const pair<sa_leaf, sa_leaf>& rhs )
	{
		return leaf_size(lhs) < leaf_size(rhs);
	});

}